

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

void G_ParseMapInfo(FString *basemapinfo)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int nindex;
  int lastlump;
  FMapInfoParser parse;
  level_info_t defaultinfo;
  level_info_t gamedefaults;
  
  lastlump = 0;
  level_info_t::level_info_t(&gamedefaults);
  ClearMapinfo();
  addterm(ClearMapinfo,"ClearMapinfo");
  if (*(int *)(basemapinfo->Chars + -0xc) != 0) {
    FMapInfoParser::FMapInfoParser(&parse,0);
    level_info_t::level_info_t(&defaultinfo);
    iVar1 = FWadCollection::GetNumForFullName(&Wads,basemapinfo);
    iVar2 = FWadCollection::GetLumpFile(&Wads,iVar1);
    if (0 < iVar2) {
      iVar2 = FWadCollection::GetLumpFile(&Wads,iVar1);
      pcVar3 = FWadCollection::GetWadFullName(&Wads,iVar2);
      I_FatalError("File %s is overriding core lump %s.",pcVar3,basemapinfo->Chars);
    }
    FMapInfoParser::ParseMapInfo(&parse,iVar1,&gamedefaults,&defaultinfo);
    level_info_t::~level_info_t(&defaultinfo);
    FScanner::~FScanner(&parse.sc);
  }
LAB_0045eade:
  iVar1 = FWadCollection::FindLumpMulti(&Wads,G_ParseMapInfo::mapinfonames,&lastlump,false,&nindex);
  if (iVar1 == -1) {
    if (AllEpisodes.Count == 0) {
      I_FatalError(
                  "You cannot use clearepisodes in a MAPINFO if you do not define any new episodes after it."
                  );
    }
    if (AllSkills.Count == 0) {
      I_FatalError(
                  "You cannot use clearskills in a MAPINFO if you do not define any new skills after it."
                  );
    }
    level_info_t::~level_info_t(&gamedefaults);
    return;
  }
  if (nindex == 0) goto LAB_0045eb48;
  goto LAB_0045eb05;
LAB_0045eb48:
  iVar2 = FWadCollection::GetLumpFile(&Wads,iVar1);
  iVar2 = FWadCollection::CheckNumForName(&Wads,"ZMAPINFO",0,iVar2,true);
  if (iVar2 < 0) {
LAB_0045eb05:
    FMapInfoParser::FMapInfoParser(&parse,(uint)(nindex == 1) * 2);
    level_info_t::level_info_t(&defaultinfo);
    FMapInfoParser::ParseMapInfo(&parse,iVar1,&gamedefaults,&defaultinfo);
    level_info_t::~level_info_t(&defaultinfo);
    FScanner::~FScanner(&parse.sc);
  }
  goto LAB_0045eade;
}

Assistant:

void G_ParseMapInfo (FString basemapinfo)
{
	int lump, lastlump = 0;
	level_info_t gamedefaults;

	ClearMapinfo();
	atterm(ClearMapinfo);

	// Parse the default MAPINFO for the current game. This lump *MUST* come from zdoom.pk3.
	if (basemapinfo.IsNotEmpty())
	{
		FMapInfoParser parse;
		level_info_t defaultinfo;
		int baselump = Wads.GetNumForFullName(basemapinfo);
		if (Wads.GetLumpFile(baselump) > 0)
		{
			I_FatalError("File %s is overriding core lump %s.", 
				Wads.GetWadFullName(Wads.GetLumpFile(baselump)), basemapinfo.GetChars());
		}
		parse.ParseMapInfo(baselump, gamedefaults, defaultinfo);
	}

	static const char *mapinfonames[] = { "MAPINFO", "ZMAPINFO", NULL };
	int nindex;

	// Parse any extra MAPINFOs.
	while ((lump = Wads.FindLumpMulti (mapinfonames, &lastlump, false, &nindex)) != -1)
	{
		if (nindex == 0)
		{
			// If this lump is named MAPINFO we need to check if the same WAD contains a ZMAPINFO lump.
			// If that exists we need to skip this one.

			int wad = Wads.GetLumpFile(lump);
			int altlump = Wads.CheckNumForName("ZMAPINFO", ns_global, wad, true);

			if (altlump >= 0) continue;
		}
		FMapInfoParser parse(nindex == 1? FMapInfoParser::FMT_New : FMapInfoParser::FMT_Unknown);
		level_info_t defaultinfo;
		parse.ParseMapInfo(lump, gamedefaults, defaultinfo);
	}

	if (AllEpisodes.Size() == 0)
	{
		I_FatalError ("You cannot use clearepisodes in a MAPINFO if you do not define any new episodes after it.");
	}
	if (AllSkills.Size() == 0)
	{
		I_FatalError ("You cannot use clearskills in a MAPINFO if you do not define any new skills after it.");
	}
}